

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# levenberg_marquardt.cpp
# Opt level: O2

void testSimpleLineFunctor(void)

{
  Status SVar1;
  ostream *poVar2;
  VectorXd x;
  Point2DVector points;
  SimpleLineFunctorNumericalDiff functor;
  LevenbergMarquardt<SimpleLineFunctorNumericalDiff,_double> local_180;
  
  poVar2 = std::operator<<((ostream *)&std::cout,"Testing f(x) = a x + b function...");
  std::endl<char,std::char_traits<char>>(poVar2);
  GeneratePoints(&points,0x32);
  local_180.parameters.factor = (double)CONCAT44(local_180.parameters.factor._4_4_,2);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix<int>(&x,(int *)&local_180);
  local_180.parameters.factor = 2.0;
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::setConstant
            ((DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x,(Scalar *)&local_180);
  functor.super_NumericalDiff<SimpleLineFunctor,_(Eigen::NumericalDiffMode)0>.
  super_SimpleLineFunctor.super_Functor<double,__1,__1>.m_inputs = -1;
  functor.super_NumericalDiff<SimpleLineFunctor,_(Eigen::NumericalDiffMode)0>.
  super_SimpleLineFunctor.super_Functor<double,__1,__1>.m_values = -1;
  functor.super_NumericalDiff<SimpleLineFunctor,_(Eigen::NumericalDiffMode)0>.
  super_SimpleLineFunctor.Points.
  super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  functor.super_NumericalDiff<SimpleLineFunctor,_(Eigen::NumericalDiffMode)0>.
  super_SimpleLineFunctor.Points.
  super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  functor.super_NumericalDiff<SimpleLineFunctor,_(Eigen::NumericalDiffMode)0>.
  super_SimpleLineFunctor.Points.
  super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  functor.super_NumericalDiff<SimpleLineFunctor,_(Eigen::NumericalDiffMode)0>.epsfcn = 0.0;
  std::
  vector<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
  ::operator=(&functor.super_NumericalDiff<SimpleLineFunctor,_(Eigen::NumericalDiffMode)0>.
               super_SimpleLineFunctor.Points,&points);
  local_180.parameters.factor = 100.0;
  local_180.parameters.maxfev = 400;
  local_180.parameters.ftol = 1.4901161193847656e-08;
  local_180.parameters.xtol = 1.4901161193847656e-08;
  local_180.parameters.gtol = 0.0;
  local_180.parameters.epsfcn = 0.0;
  local_180.fvec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_180.fvec.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  local_180.qtf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_180.qtf.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_180.diag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_180.diag.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0
  ;
  local_180.fjac.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_data =
       (double *)0x0;
  local_180.fjac.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_rows =
       0;
  local_180.fjac.super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.m_storage.m_cols =
       0;
  local_180.permutation.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
  m_storage.m_data = (int *)0x0;
  local_180.permutation.m_indices.super_PlainObjectBase<Eigen::Matrix<int,__1,_1,_0,__1,_1>_>.
  m_storage.m_rows = 0;
  local_180.functor = &functor;
  local_180.nfev = 0;
  local_180.njev = 0;
  local_180.iter = 0;
  local_180.fnorm._0_1_ = 0;
  local_180.fnorm._1_7_ = 0;
  local_180.gnorm._0_1_ = 0;
  local_180._169_8_ = 0;
  local_180.wa1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_180.wa1.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_180.wa2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_180.wa2.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_180.wa3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_180.wa3.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  local_180.wa4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data =
       (double *)0x0;
  local_180.wa4.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows = 0;
  SVar1 = Eigen::LevenbergMarquardt<SimpleLineFunctorNumericalDiff,_double>::minimize(&local_180,&x)
  ;
  poVar2 = std::operator<<((ostream *)&std::cout,"status: ");
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,SVar1);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"x that minimizes the function: ");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = Eigen::operator<<(poVar2,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&x);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"lm.parameters.epsfcn: ");
  poVar2 = std::ostream::_M_insert<double>(local_180.parameters.epsfcn);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"lm.parameters.factor: ");
  poVar2 = std::ostream::_M_insert<double>(local_180.parameters.factor);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"lm.parameters.ftol: ");
  poVar2 = std::ostream::_M_insert<double>(local_180.parameters.ftol);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"lm.parameters.gtol: ");
  poVar2 = std::ostream::_M_insert<double>(local_180.parameters.gtol);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"lm.parameters.maxfev: ");
  poVar2 = std::ostream::_M_insert<long>((long)poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  std::operator<<((ostream *)&std::cout,"lm.parameters.xtol: ");
  poVar2 = std::ostream::_M_insert<double>(local_180.parameters.xtol);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,
                           "~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~");
  std::endl<char,std::char_traits<char>>(poVar2);
  Eigen::LevenbergMarquardt<SimpleLineFunctorNumericalDiff,_double>::~LevenbergMarquardt(&local_180)
  ;
  free(functor.super_NumericalDiff<SimpleLineFunctor,_(Eigen::NumericalDiffMode)0>.
       super_SimpleLineFunctor.Points.
       super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start);
  free(x.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_data);
  free(points.
       super__Vector_base<Eigen::Matrix<double,_2,_1,_0,_2,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>
       ._M_impl.super__Vector_impl_data._M_start);
  return;
}

Assistant:

void testSimpleLineFunctor()
{
    std::cout << "Testing f(x) = a x + b function..." << std::endl;

    unsigned int numberOfPoints = 50;
    Point2DVector points = GeneratePoints(numberOfPoints);

    Eigen::VectorXd x(2);
    x.fill(2.0f);

    SimpleLineFunctorNumericalDiff functor;
    functor.Points = points;
    Eigen::LevenbergMarquardt<SimpleLineFunctorNumericalDiff> lm(functor);

    Eigen::LevenbergMarquardtSpace::Status status = lm.minimize(x);
    std::cout << "status: " << status << std::endl;
    std::cout << "x that minimizes the function: " << std::endl << x << std::endl;
    std::cout <<"lm.parameters.epsfcn: " <<lm.parameters.epsfcn << std::endl;
    std::cout <<"lm.parameters.factor: " <<lm.parameters.factor << std::endl;
    std::cout <<"lm.parameters.ftol: " << lm.parameters.ftol << std::endl;
    std::cout <<"lm.parameters.gtol: " <<lm.parameters.gtol << std::endl;
    std::cout <<"lm.parameters.maxfev: " <<lm.parameters.maxfev << std::endl;
    std::cout <<"lm.parameters.xtol: " <<lm.parameters.xtol << std::endl;

    std::cout << "~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~~" << std::endl;

}